

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

void __thiscall BMP::writeFrequency(BMP *this,ofstream *out)

{
  pointer pcVar1;
  uint uVar2;
  ostream *poVar3;
  GreyCount *pGVar4;
  long lVar5;
  GreyCount *pGVar6;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  lVar5 = (long)this->alphabet->num;
  if (lVar5 != 0) {
    pGVar4 = this->alphabet->symbol;
    pGVar6 = pGVar4 + lVar5;
    do {
      uVar2 = *(uint *)&pGVar4->tone;
      local_98[0] = local_88;
      pcVar1 = (pGVar4->uniformCodes)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + (pGVar4->uniformCodes)._M_string_length);
      pcVar1 = (pGVar4->codeShannonFano)._M_dataplus._M_p;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar1,pcVar1 + (pGVar4->codeShannonFano)._M_string_length);
      pcVar1 = (pGVar4->codeHuffman)._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + (pGVar4->codeHuffman)._M_string_length);
      if (out == (ofstream *)0x0) {
        *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 8;
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2 & 0xff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      else {
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,uVar2 & 0xff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != pGVar6);
  }
  return;
}

Assistant:

void BMP::writeFrequency( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            (*out) << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        } else {
            cout << setw( 8 ) << ( int ) a.tone << ": " << a.num << endl;
        }
    });
}